

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Master.cpp
# Opt level: O0

void __thiscall
Master::freeROMImages(Master *this,ROMImage **controlROMImage,ROMImage **pcmROMImage)

{
  bool bVar1;
  SynthRoute **ppSVar2;
  File *pFVar3;
  QList<SynthRoute_*> *extraout_RDX;
  bool local_a2;
  bool local_a1;
  SynthRoute *synthRoute;
  undefined1 local_68 [8];
  QForeachContainer<QList<SynthRoute_*>_> _container_558;
  ROMImage *synthPCMROMImage;
  ROMImage *synthControlROMImage;
  bool pcmROMInUse;
  ROMImage **ppRStack_20;
  bool controlROMInUse;
  ROMImage **pcmROMImage_local;
  ROMImage **controlROMImage_local;
  Master *this_local;
  
  if ((*controlROMImage != (ROMImage *)0x0) || (*pcmROMImage != (ROMImage *)0x0)) {
    synthControlROMImage._7_1_ = false;
    synthControlROMImage._6_1_ = false;
    synthPCMROMImage = (ROMImage *)0x0;
    _container_558.control = 0;
    _container_558._44_4_ = 0;
    ppRStack_20 = pcmROMImage;
    pcmROMImage_local = controlROMImage;
    controlROMImage_local = (ROMImage **)this;
    if (this->audioFileWriterSynth != (QSynth *)0x0) {
      QSynth::getROMImages
                (this->audioFileWriterSynth,&synthPCMROMImage,(ROMImage **)&_container_558.control);
      synthControlROMImage._7_1_ = synthPCMROMImage == *pcmROMImage_local;
      synthControlROMImage._6_1_ = (ROMImage *)_container_558._40_8_ == *ppRStack_20;
      pcmROMImage = (ROMImage **)extraout_RDX;
      if (((bool)synthControlROMImage._7_1_) && ((bool)synthControlROMImage._6_1_)) {
        return;
      }
    }
    QtPrivate::qMakeForeachContainer<QList<SynthRoute*>const&>
              ((QForeachContainer<QList<SynthRoute_*>_> *)local_68,(QtPrivate *)&this->synthRoutes,
               (QList<SynthRoute_*> *)pcmROMImage);
    while (bVar1 = QList<SynthRoute_*>::const_iterator::operator!=
                             ((const_iterator *)&_container_558.c.d.size,_container_558.i), bVar1) {
      ppSVar2 = QList<SynthRoute_*>::const_iterator::operator*
                          ((const_iterator *)&_container_558.c.d.size);
      SynthRoute::getROMImages(*ppSVar2,&synthPCMROMImage,(ROMImage **)&_container_558.control);
      local_a1 = true;
      if ((synthControlROMImage._7_1_ & 1) == 0) {
        local_a1 = synthPCMROMImage == *pcmROMImage_local;
      }
      synthControlROMImage._7_1_ = local_a1;
      local_a2 = true;
      if ((synthControlROMImage._6_1_ & 1) == 0) {
        local_a2 = (ROMImage *)_container_558._40_8_ == *ppRStack_20;
      }
      synthControlROMImage._6_1_ = local_a2;
      if ((local_a1 != false) && (local_a2 != false)) {
        synthRoute._0_4_ = 1;
        goto LAB_0013f639;
      }
      QList<SynthRoute_*>::const_iterator::operator++((const_iterator *)&_container_558.c.d.size);
    }
    synthRoute._0_4_ = 2;
LAB_0013f639:
    QtPrivate::QForeachContainer<QList<SynthRoute_*>_>::~QForeachContainer
              ((QForeachContainer<QList<SynthRoute_*>_> *)local_68);
    if ((int)synthRoute != 1) {
      if (((synthControlROMImage._7_1_ & 1) == 0) && (*pcmROMImage_local != (ROMImage *)0x0)) {
        bVar1 = MT32Emu::ROMImage::isFileUserProvided(*pcmROMImage_local);
        if ((bVar1) &&
           (pFVar3 = MT32Emu::ROMImage::getFile(*pcmROMImage_local), pFVar3 != (File *)0x0)) {
          (*pFVar3->_vptr_File[1])();
        }
        MT32Emu::ROMImage::freeROMImage(*pcmROMImage_local);
        *pcmROMImage_local = (ROMImage *)0x0;
      }
      if (((synthControlROMImage._6_1_ & 1) == 0) && (*ppRStack_20 != (ROMImage *)0x0)) {
        bVar1 = MT32Emu::ROMImage::isFileUserProvided(*ppRStack_20);
        if ((bVar1) && (pFVar3 = MT32Emu::ROMImage::getFile(*ppRStack_20), pFVar3 != (File *)0x0)) {
          (*pFVar3->_vptr_File[1])();
        }
        MT32Emu::ROMImage::freeROMImage(*ppRStack_20);
        *ppRStack_20 = (ROMImage *)0x0;
      }
    }
  }
  return;
}

Assistant:

void Master::freeROMImages(const MT32Emu::ROMImage *&controlROMImage, const MT32Emu::ROMImage *&pcmROMImage) const {
	if (controlROMImage == NULL && pcmROMImage == NULL) return;
	bool controlROMInUse = false;
	bool pcmROMInUse = false;
	const MT32Emu::ROMImage *synthControlROMImage = NULL;
	const MT32Emu::ROMImage *synthPCMROMImage = NULL;
	if (audioFileWriterSynth != NULL) {
		audioFileWriterSynth->getROMImages(synthControlROMImage, synthPCMROMImage);
		controlROMInUse = synthControlROMImage == controlROMImage;
		pcmROMInUse = synthPCMROMImage == pcmROMImage;
		if (controlROMInUse && pcmROMInUse) return;
	}
	foreach (SynthRoute *synthRoute, synthRoutes) {
		synthRoute->getROMImages(synthControlROMImage, synthPCMROMImage);
		controlROMInUse = controlROMInUse || (synthControlROMImage == controlROMImage);
		pcmROMInUse = pcmROMInUse || (synthPCMROMImage == pcmROMImage);
		if (controlROMInUse && pcmROMInUse) return;
	}
	if (!controlROMInUse && controlROMImage != NULL) {
		if (controlROMImage->isFileUserProvided()) delete controlROMImage->getFile();
		MT32Emu::ROMImage::freeROMImage(controlROMImage);
		controlROMImage = NULL;
	}
	if (!pcmROMInUse && pcmROMImage != NULL) {
		if (pcmROMImage->isFileUserProvided()) delete pcmROMImage->getFile();
		MT32Emu::ROMImage::freeROMImage(pcmROMImage);
		pcmROMImage = NULL;
	}
}